

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O2

int32_t __thiscall icu_63::RegexCompile::allocateData(RegexCompile *this,int32_t size)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = 0;
    if (0xfffffeff < size - 0x101U) {
      iVar1 = this->fRXPat->fDataSize;
      iVar2 = 0;
      if ((-1 < iVar1) &&
         (this->fRXPat->fDataSize = size + iVar1, iVar2 = iVar1, (uint)(size + iVar1) < 0xfffff0)) {
        return iVar1;
      }
    }
    error(this,U_REGEX_ERROR_START);
  }
  return iVar2;
}

Assistant:

int32_t RegexCompile::allocateData(int32_t size) {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }
    if (size <= 0 || size > 0x100 || fRXPat->fDataSize < 0) {
        error(U_REGEX_INTERNAL_ERROR);
        return 0;
    }
    int32_t dataIndex = fRXPat->fDataSize;
    fRXPat->fDataSize += size;
    if (fRXPat->fDataSize >= 0x00fffff0) {
        error(U_REGEX_INTERNAL_ERROR);
    }
    return dataIndex;
}